

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O2

bool __thiscall crnlib::ktx_texture::consistency_check(ktx_texture *this)

{
  uint32 uVar1;
  uint32 uVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint face;
  uint uVar16;
  uint32 uVar17;
  ulong uVar18;
  uint array_element;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint bytes_per_block;
  uint block_dim;
  uint local_58;
  uint local_54 [9];
  
  bVar7 = check_header(this);
  if (bVar7) {
    local_54[0] = 0;
    local_58 = 0;
    uVar1 = (this->m_header).m_glType;
    uVar2 = (this->m_header).m_glFormat;
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        return false;
      }
      bVar7 = get_ogl_fmt_desc((this->m_header).m_glInternalFormat,0,local_54,&local_58);
      if (!bVar7 || local_54[0] == 1) {
        return false;
      }
    }
    else {
      if (uVar2 == 0) {
        return false;
      }
      bVar7 = get_ogl_fmt_desc(uVar2,uVar1,local_54,&local_58);
      if (1 < local_54[0] || !bVar7) {
        return false;
      }
    }
    if ((this->m_block_dim == local_54[0]) && (this->m_bytes_per_block == local_58)) {
      uVar3 = (this->m_image_data).m_size;
      uVar8 = get_total_images(this);
      uVar14 = 0;
      if (uVar3 != uVar8) {
        return false;
      }
      uVar1 = (this->m_header).m_numberOfMipmapLevels;
      uVar2 = (this->m_header).m_pixelHeight;
      uVar4 = (this->m_header).m_pixelDepth;
      uVar23 = uVar4 + (uVar4 == 0);
      uVar5 = this->m_block_dim;
      uVar4 = (this->m_header).m_numberOfArrayElements;
      iVar22 = uVar4 + (uVar4 == 0);
      uVar4 = (this->m_header).m_numberOfFaces;
      iVar19 = uVar4 * uVar23;
      iVar11 = 0;
      while( true ) {
        bVar7 = iVar11 == uVar1 + (uVar1 == 0);
        if (bVar7) {
          return bVar7;
        }
        bVar10 = (byte)iVar11;
        uVar16 = (this->m_header).m_pixelWidth >> (bVar10 & 0x1f);
        uVar9 = uVar2 + (uVar2 == 0) >> (bVar10 & 0x1f);
        uVar16 = uVar16 + (uVar16 == 0) + (uVar5 - 1);
        if (uVar16 < uVar5) break;
        uVar9 = uVar9 + (uVar9 == 0) + (uVar5 - 1);
        if (uVar9 < uVar5) {
          return bVar7;
        }
        uVar21 = uVar23 >> (bVar10 & 0x1f);
        uVar13 = uVar14;
        for (iVar20 = 0; iVar20 != iVar22; iVar20 = iVar20 + 1) {
          uVar12 = uVar13;
          for (uVar17 = 0; uVar15 = (ulong)(uVar21 + (uVar21 == 0)), uVar6 = uVar12, uVar17 != uVar4
              ; uVar17 = uVar17 + 1) {
            while( true ) {
              uVar18 = (ulong)uVar6;
              if (uVar15 == 0) break;
              uVar15 = uVar15 - 1;
              uVar6 = uVar6 + 1;
              if ((this->m_image_data).m_p[uVar18].m_size !=
                  (uVar16 / uVar5) * (uVar9 / uVar5) * this->m_bytes_per_block) {
                return false;
              }
            }
            uVar12 = uVar12 + uVar23;
          }
          uVar13 = uVar13 + iVar19;
        }
        iVar11 = iVar11 + 1;
        uVar14 = uVar14 + iVar19 * iVar22;
      }
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool ktx_texture::consistency_check() const
    {
        if (!check_header())
        {
            return false;
        }

        uint block_dim = 0, bytes_per_block = 0;
        if ((!m_header.m_glType) || (!m_header.m_glFormat))
        {
            if ((m_header.m_glType) || (m_header.m_glFormat))
            {
                return false;
            }
            if (!get_ogl_fmt_desc(m_header.m_glInternalFormat, m_header.m_glType, block_dim, bytes_per_block))
            {
                return false;
            }
            if (block_dim == 1)
            {
                return false;
            }
            //if ((get_width() % block_dim) || (get_height() % block_dim))
            //   return false;
        }
        else
        {
            if (!get_ogl_fmt_desc(m_header.m_glFormat, m_header.m_glType, block_dim, bytes_per_block))
            {
                return false;
            }
            if (block_dim > 1)
            {
                return false;
            }
        }
        if ((m_block_dim != block_dim) || (m_bytes_per_block != bytes_per_block))
        {
            return false;
        }

        if (m_image_data.size() != get_total_images())
        {
            return false;
        }

        for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
        {
            uint mip_width, mip_height, mip_depth;
            get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

            const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
            const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
            if ((!mip_row_blocks) || (!mip_col_blocks))
            {
                return false;
            }

            for (uint array_element = 0; array_element < get_array_size(); array_element++)
            {
                for (uint face = 0; face < get_num_faces(); face++)
                {
                    for (uint zslice = 0; zslice < mip_depth; zslice++)
                    {
                        const uint8_vec& image_data = get_image_data(get_image_index(mip_level, array_element, face, zslice));

                        uint expected_image_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                        if (image_data.size() != expected_image_size)
                        {
                            return false;
                        }
                    }
                }
            }
        }

        return true;
    }